

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-list.c
# Opt level: O2

void monster_list_collect(monster_list_t *list)

{
  undefined8 *puVar1;
  short *psVar2;
  monster_list_entry_t *pmVar3;
  monster_race *pmVar4;
  loc grid1;
  loc grid2;
  uint uVar5;
  size_t sVar6;
  player *ppVar7;
  _Bool _Var8;
  wchar_t wVar9;
  wchar_t wVar10;
  monster *mon;
  ulong uVar11;
  long lVar12;
  
  if (((list != (monster_list_t *)0x0) && (list->entries != (monster_list_entry_t *)0x0)) &&
     (sVar6 = list->entries_size, wVar9 = cave_monster_max(cave), wVar9 <= (wchar_t)sVar6)) {
    for (wVar9 = L'\x01'; wVar10 = cave_monster_max(cave), wVar9 < wVar10; wVar9 = wVar9 + L'\x01')
    {
      mon = cave_monster(cave,wVar9);
      _Var8 = monster_is_visible(mon);
      if ((_Var8) && (_Var8 = monster_is_camouflaged(mon), !_Var8)) {
        uVar5 = (uint)list->entries_size;
        uVar11 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar11 = 0;
        }
        for (lVar12 = 0; uVar11 * 0x28 - lVar12 != 0; lVar12 = lVar12 + 0x28) {
          pmVar3 = list->entries;
          pmVar4 = *(monster_race **)((long)pmVar3->count + lVar12 + -0x10);
          if (pmVar4 == (monster_race *)0x0) {
            puVar1 = (undefined8 *)((long)pmVar3->count + lVar12);
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1 = (undefined8 *)((long)pmVar3->count + lVar12 + -0x10);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined8 *)((long)pmVar3->dy + lVar12) = 0;
            *(monster_race **)((long)pmVar3->count + lVar12 + -0x10) = mon->race;
            *(player_race **)((long)pmVar3->count + lVar12 + -8) = mon->player_race;
LAB_00171345:
            *(uint8_t *)((long)pmVar3->dy + lVar12 + 4) = mon->attr;
            grid1.x = (player->grid).x;
            grid1.y = (player->grid).y;
            grid2.x = (mon->grid).x;
            grid2.y = (mon->grid).y;
            _Var8 = projectable((chunk *)cave,grid1,grid2,L'\0');
            uVar11 = (ulong)!_Var8;
            psVar2 = (short *)((long)pmVar3->count + uVar11 * 2 + lVar12);
            *psVar2 = *psVar2 + 1;
            if (0 < mon->m_timed[0]) {
              psVar2 = (short *)((long)pmVar3->asleep + lVar12 + uVar11 * 2);
              *psVar2 = *psVar2 + 1;
            }
            if (L'\xffffffff' < (mon->target).midx) {
              psVar2 = (short *)((long)pmVar3->neutral + lVar12 + uVar11 * 2);
              *psVar2 = *psVar2 + 1;
            }
            ppVar7 = player;
            *(short *)((long)pmVar3->dx + lVar12 + uVar11 * 2) =
                 (short)(mon->grid).x - (short)(player->grid).x;
            *(short *)((long)pmVar3->dy + lVar12 + uVar11 * 2) =
                 (short)(mon->grid).y - (short)(ppVar7->grid).y;
            break;
          }
          if ((pmVar4 == mon->race) &&
             (*(player_race **)((long)pmVar3->count + lVar12 + -8) == mon->player_race))
          goto LAB_00171345;
        }
      }
    }
    uVar5 = (uint)list->entries_size;
    lVar12 = 0;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    for (; (ulong)uVar5 * 0x28 - lVar12 != 0; lVar12 = lVar12 + 0x28) {
      pmVar3 = list->entries;
      if (*(long *)((long)pmVar3->count + lVar12 + -0x10) != 0) {
        if (*(short *)((long)pmVar3->count + lVar12) != 0) {
          list->total_entries[0] = list->total_entries[0] + 1;
        }
        if (*(short *)((long)pmVar3->count + lVar12 + 2) != 0) {
          list->total_entries[1] = list->total_entries[1] + 1;
        }
        list->total_monsters[0] = list->total_monsters[0] + *(short *)((long)pmVar3->count + lVar12)
        ;
        list->total_monsters[1] =
             list->total_monsters[1] + *(short *)((long)pmVar3->count + lVar12 + 2);
        list->distinct_entries = list->distinct_entries + 1;
      }
    }
    list->creation_turn = turn;
    list->sorted = false;
  }
  return;
}

Assistant:

void monster_list_collect(monster_list_t *list)
{
	int i;

	if (list == NULL || list->entries == NULL)
		return;

	if (!monster_list_can_update(list))
		return;

	/* Use cave_monster_max() here in case the monster list isn't compacted. */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);
		monster_list_entry_t *entry = NULL;
		int j, field;
		bool los = false;

		/* Only consider visible, known monsters */
		if (!monster_is_visible(mon) ||	monster_is_camouflaged(mon))
			continue;

		/* Find or add a list entry. */
		for (j = 0; j < (int)list->entries_size; j++) {
			if (list->entries[j].race == NULL) {
				/* We found an empty slot, so add this race here. */
				entry = &list->entries[j];
				memset(entry, 0, sizeof(monster_list_entry_t));
				entry->race = mon->race;
				entry->p_race = mon->player_race;
				break;
			} else if ((list->entries[j].race == mon->race) &&
					   (list->entries[j].p_race == mon->player_race)) {
				/* We found a matching race and we'll use that. */
				entry = &list->entries[j];
				break;
			}
		}

		if (entry == NULL)
			continue;

		/* Always collect the latest monster attribute so that flicker
		 * animation works. If this is 0, it needs to be replaced by 
		 * the standard glyph in the UI */
		entry->attr = mon->attr;

		/*
		 * Check for LOS
		 * Hack - we should use (mon->mflag & (MFLAG_VIEW)) here,
		 * but this does not catch monsters detected by ESP which are
		 * targetable, so we cheat and use projectable() instead
		 */
		los = projectable(cave, player->grid, mon->grid, PROJECT_NONE);
		field = (los) ? MONSTER_LIST_SECTION_LOS : MONSTER_LIST_SECTION_ESP;
		entry->count[field]++;

		if (mon->m_timed[MON_TMD_SLEEP] > 0)
			entry->asleep[field]++;
		if (mon->target.midx >= 0)
			entry->neutral[field]++;

		/* Store the location offset from the player; this is only used for
		 * monster counts of 1 */
		entry->dx[field] = mon->grid.x - player->grid.x;
		entry->dy[field] = mon->grid.y - player->grid.y;
	}

	/* Collect totals for easier calculations of the list. */
	for (i = 0; i < (int)list->entries_size; i++) {
		if (list->entries[i].race == NULL)
			continue;

		if (list->entries[i].count[MONSTER_LIST_SECTION_LOS] > 0)
			list->total_entries[MONSTER_LIST_SECTION_LOS]++;

		if (list->entries[i].count[MONSTER_LIST_SECTION_ESP] > 0)
			list->total_entries[MONSTER_LIST_SECTION_ESP]++;

		list->total_monsters[MONSTER_LIST_SECTION_LOS] +=
			list->entries[i].count[MONSTER_LIST_SECTION_LOS];
		list->total_monsters[MONSTER_LIST_SECTION_ESP] +=
			list->entries[i].count[MONSTER_LIST_SECTION_ESP];
		list->distinct_entries++;
	}

	list->creation_turn = turn;
	list->sorted = false;
}